

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

char * rtosc_bundle_fetch(char *buffer,uint elm)

{
  uint32_t uVar1;
  uint in_ESI;
  long in_RDI;
  bool bVar2;
  size_t elm_pos;
  uint32_t *lengths;
  uint8_t *local_30;
  ulong local_20;
  uint8_t *local_18;
  
  local_18 = (uint8_t *)(in_RDI + 0x10);
  local_20 = 0;
  while( true ) {
    bVar2 = false;
    if (local_20 != in_ESI) {
      uVar1 = extract_uint32(local_18);
      bVar2 = uVar1 != 0;
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
    uVar1 = extract_uint32(local_18);
    local_18 = local_18 + (ulong)((uVar1 >> 2) + 1) * 4;
  }
  if (in_ESI == local_20) {
    local_30 = local_18 + 4;
  }
  else {
    local_30 = (uint8_t *)0x0;
  }
  return (char *)local_30;
}

Assistant:

const char *rtosc_bundle_fetch(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    while(elm_pos!=elm && extract_uint32((const uint8_t*)lengths)) {
        ++elm_pos;
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return (const char*) (elm==elm_pos?lengths+1:NULL);
}